

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall ExecutionEngine::i_baload(ExecutionEngine *this)

{
  undefined1 auVar1 [16];
  int iVar2;
  ValueType VVar3;
  VMStack *this_00;
  Frame *this_01;
  ostream *poVar4;
  bool bVar5;
  Value VVar6;
  Value VVar7;
  undefined1 local_58 [8];
  Value value;
  Value arrayref;
  Value index;
  ArrayObject *array;
  Frame *topFrame;
  VMStack *stackFrame;
  ExecutionEngine *this_local;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  VVar6 = Frame::popTopOfOperandStack(this_01);
  arrayref.data.longValue._4_4_ = VVar6.type;
  if (arrayref.data.longValue._4_4_ != 4) {
    __assert_fail("index.type == ValueType::INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x422,"void ExecutionEngine::i_baload()");
  }
  VVar7 = Frame::popTopOfOperandStack(this_01);
  value.data.longValue._4_4_ = VVar7.type;
  if (value.data.longValue._4_4_ != 9) {
    __assert_fail("arrayref.type == ValueType::REFERENCE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x424,"void ExecutionEngine::i_baload()");
  }
  arrayref._0_8_ = VVar7.data;
  iVar2 = (*(code *)**(undefined8 **)arrayref._0_8_)();
  if (iVar2 != 2) {
    __assert_fail("(arrayref.data.object)->objectType() == ObjectType::ARRAY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x425,"void ExecutionEngine::i_baload()");
  }
  if (arrayref._0_8_ == 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"NullPointerException");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  index.printType = VVar6.data._0_4_;
  VVar3 = ArrayObject::getSize((ArrayObject *)arrayref._0_8_);
  if ((index.printType <= VVar3) && (-1 < (int)index.printType)) {
    VVar6 = ArrayObject::getValue((ArrayObject *)arrayref._0_8_,index.printType);
    local_58._4_4_ = VVar6.type;
    if (BYTE < (uint)local_58._4_4_) {
      __assert_fail("value.type == ValueType::BOOLEAN || value.type == ValueType::BYTE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                    ,0x433,"void ExecutionEngine::i_baload()");
    }
    bVar5 = local_58._4_4_ == BOOLEAN;
    value.printType._0_1_ = VVar6.data._0_1_;
    value.type = VVar6.data._4_4_;
    local_58 = VVar6._0_8_;
    if (bVar5) {
      value.printType._0_1_ = (undefined1)value.printType & BYTE;
      value.printType._1_3_ = 0;
      auVar1._12_4_ = 0;
      auVar1._0_12_ = stack0xffffffffffffffac;
      _local_58 = auVar1 << 0x20;
    }
    else {
      value.printType = (int)(char)(undefined1)value.printType;
      local_58._0_4_ = 1;
    }
    VVar6.data = (anon_union_8_10_52016fac_for_data)value._0_8_;
    VVar6.printType = local_58._0_4_;
    VVar6.type = 4;
    Frame::pushIntoOperandStack(this_01,VVar6);
    this_01->pc = this_01->pc + 1;
    return;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"ArrayIndexOutOfBoundsException");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  exit(2);
}

Assistant:

void ExecutionEngine::i_baload() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();
	ArrayObject *array;

    Value index = topFrame->popTopOfOperandStack();
    assert(index.type == ValueType::INT);
    Value arrayref = topFrame->popTopOfOperandStack();
    assert(arrayref.type == ValueType::REFERENCE);
    assert((arrayref.data.object)->objectType() == ObjectType::ARRAY);

    array = (ArrayObject *) arrayref.data.object;

    if (array == NULL) {
        cerr << "NullPointerException" << endl;
        exit(1);
    }
    if (index.data.intValue > array->getSize() || index.data.intValue < 0) {
        cerr << "ArrayIndexOutOfBoundsException" << endl;
        exit(2);
    }

    Value value = array->getValue(index.data.intValue);
    assert(value.type == ValueType::BOOLEAN || value.type == ValueType::BYTE);
    
    if (value.type == ValueType::BOOLEAN) {
        value.data.intValue = (uint32_t) value.data.booleanValue;
        value.printType = ValueType::BOOLEAN;
    } else {
        value.data.intValue = (int32_t) value.data.byteValue;
        value.printType = ValueType::BYTE;
    }
    value.type = ValueType::INT;

    topFrame->pushIntoOperandStack(value);
    topFrame->pc += 1;
}